

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O1

void __thiscall
cmDocumentationFormatter::PrintSection
          (cmDocumentationFormatter *this,ostream *os,cmDocumentationSection *section)

{
  pointer pcVar1;
  pointer pcVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  ulong uVar5;
  char *__s;
  ostream *poVar6;
  size_t sVar7;
  cmDocumentationEntry *entry;
  pointer pcVar8;
  int iVar9;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar1 = (section->Name)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (section->Name)._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pcVar2 = (section->Entries).
           super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar8 = (section->Entries).
                super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                _M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar2; pcVar8 = pcVar8 + 1) {
    if ((pcVar8->Name)._M_string_length == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      this->TextIndent = "";
      PrintFormatted(this,os,(pcVar8->Brief)._M_dataplus._M_p);
    }
    else {
      pp_Var3 = os->_vptr_basic_ostream;
      *(undefined8 *)(&os->field_0x10 + (long)pp_Var3[-3]) = 2;
      p_Var4 = pp_Var3[-3];
      *(uint *)(&os->field_0x18 + (long)p_Var4) =
           *(uint *)(&os->field_0x18 + (long)p_Var4) & 0xffffff4f | 0x20;
      uVar5 = (ulong)local_50 >> 8;
      local_50 = (long *)CONCAT71((int7)uVar5,pcVar8->CustomNamePrefix);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(pcVar8->Name)._M_dataplus._M_p,(pcVar8->Name)._M_string_length);
      this->TextIndent = "                                 ";
      iVar9 = (int)(pcVar8->Name)._M_string_length;
      if (iVar9 < 0x1d) {
        iVar9 = iVar9 + -0x1d;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
      }
      uVar5 = (pcVar8->Name)._M_string_length;
      sVar7 = strlen(this->TextIndent);
      if (sVar7 - 4 < uVar5) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        __s = this->TextIndent;
        strlen(__s);
        std::ostream::write((char *)os,(long)__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"= ",2);
      PrintColumn(this,os,(pcVar8->Brief)._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void cmDocumentationFormatter::PrintSection(
  std::ostream& os, cmDocumentationSection const& section)
{
  os << section.GetName() << "\n";

  const std::vector<cmDocumentationEntry>& entries = section.GetEntries();
  for (cmDocumentationEntry const& entry : entries) {
    if (!entry.Name.empty()) {
      os << std::setw(2) << std::left << entry.CustomNamePrefix << entry.Name;
      this->TextIndent = "                                 ";
      int align = static_cast<int>(strlen(this->TextIndent)) - 4;
      for (int i = static_cast<int>(entry.Name.size()); i < align; ++i) {
        os << " ";
      }
      if (entry.Name.size() > strlen(this->TextIndent) - 4) {
        os << "\n";
        os.write(this->TextIndent, strlen(this->TextIndent) - 2);
      }
      os << "= ";
      this->PrintColumn(os, entry.Brief.c_str());
      os << "\n";
    } else {
      os << "\n";
      this->TextIndent = "";
      this->PrintFormatted(os, entry.Brief.c_str());
    }
  }
  os << "\n";
}